

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_4bf6b6::HandleReadElfCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view sVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  *pcVar6;
  cmArgumentParser<Arguments> *pcVar7;
  char *fname;
  ulong uVar8;
  cmMakefile *pcVar9;
  static_string_view sVar10;
  char local_352 [2];
  char *local_350;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  string local_340 [8];
  string runpath;
  StringEntry *se_runpath;
  char local_302 [2];
  char *local_300;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  string local_2f0 [8];
  string rpath;
  StringEntry *se_rpath;
  cmAlphaNum local_2b8;
  cmAlphaNum local_288;
  string local_258;
  undefined1 local_238 [8];
  cmELF elf;
  cmAlphaNum local_208;
  cmAlphaNum local_1d8;
  string local_1a8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_188;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_178;
  undefined1 local_168 [8];
  Arguments arguments;
  cmArgumentParser<Arguments> local_d8;
  const_reference local_60;
  string *fileNameArg;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar2 = local_20;
  if (sVar5 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "READ_ELF must be called with at least three additional arguments.",&local_41);
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    local_60 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
    if (((anonymous_namespace)::
         HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::parser == '\0') &&
       (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::parser), iVar4 != 0)) {
      local_d8.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
      local_d8.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
      local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_d8.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
      local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object
           = (void *)0x0;
      local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
      local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_d8.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
      _M_object = (void *)0x0;
      local_d8.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cmArgumentParser<Arguments>::cmArgumentParser(&local_d8);
      sVar10 = ::cm::operator____s("RPATH",5);
      pcVar6 = (cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  ::Bind<std::__cxx11::string>
                            ((cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                              *)&local_d8,sVar10,0);
      sVar10 = ::cm::operator____s("RUNPATH",7);
      pcVar6 = (cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  ::Bind<std::__cxx11::string>(pcVar6,sVar10,0x20);
      sVar10 = ::cm::operator____s("CAPTURE_ERROR",0xd);
      arguments.Error.field_2._8_8_ = sVar10.super_string_view._M_len;
      pcVar7 = cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
               ::Bind<std::__cxx11::string>(pcVar6,sVar10,0x40);
      cmArgumentParser<Arguments>::cmArgumentParser(&HandleReadElfCommand::parser,pcVar7);
      cmArgumentParser<Arguments>::~cmArgumentParser(&local_d8);
      __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleReadElfCommand::parser,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
    local_188 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local);
    local_178 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance(&local_188,2);
    cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((Arguments *)local_168,
               (cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&HandleReadElfCommand::parser,&local_178,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0,0);
    bVar3 = cmsys::SystemTools::FileExists(local_60,true);
    pcVar2 = local_20;
    if (bVar3) {
      fname = (char *)std::__cxx11::string::c_str();
      cmELF::cmELF((cmELF *)local_238,fname);
      bVar3 = cmELF::operator_cast_to_bool((cmELF *)local_238);
      if (bVar3) {
        uVar8 = std::__cxx11::string::empty();
        if (((uVar8 & 1) == 0) &&
           (rpath.field_2._8_8_ = cmELF::GetRPath((cmELF *)local_238),
           (StringEntry *)rpath.field_2._8_8_ != (StringEntry *)0x0)) {
          std::__cxx11::string::string(local_2f0,(string *)rpath.field_2._8_8_);
          local_2f8._M_current = (char *)std::__cxx11::string::begin();
          local_300 = (char *)std::__cxx11::string::end();
          local_302[1] = 0x3a;
          local_302[0] = ';';
          std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    (local_2f8,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_300,local_302 + 1,local_302);
          pcVar9 = cmExecutionStatus::GetMakefile(local_20);
          sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_2f0);
          cmMakefile::AddDefinition(pcVar9,(string *)local_168,sVar1);
          std::__cxx11::string::~string(local_2f0);
        }
        uVar8 = std::__cxx11::string::empty();
        if (((uVar8 & 1) == 0) &&
           (runpath.field_2._8_8_ = cmELF::GetRunPath((cmELF *)local_238),
           (StringEntry *)runpath.field_2._8_8_ != (StringEntry *)0x0)) {
          std::__cxx11::string::string(local_340,(string *)runpath.field_2._8_8_);
          local_348._M_current = (char *)std::__cxx11::string::begin();
          local_350 = (char *)std::__cxx11::string::end();
          local_352[1] = 0x3a;
          local_352[0] = ';';
          std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    (local_348,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_350,local_352 + 1,local_352);
          pcVar9 = cmExecutionStatus::GetMakefile(local_20);
          sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_340);
          cmMakefile::AddDefinition(pcVar9,(string *)((long)&arguments.RPath.field_2 + 8),sVar1);
          std::__cxx11::string::~string(local_340);
        }
        args_local._7_1_ = 1;
      }
      else {
        uVar8 = std::__cxx11::string::empty();
        pcVar2 = local_20;
        if ((uVar8 & 1) == 0) {
          pcVar9 = cmExecutionStatus::GetMakefile(local_20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&se_rpath,
                     "not a valid ELF file");
          cmMakefile::AddDefinition
                    (pcVar9,(string *)((long)&arguments.RunPath.field_2 + 8),_se_rpath);
          args_local._7_1_ = 1;
        }
        else {
          cmAlphaNum::cmAlphaNum(&local_288,"READ_ELF given FILE:\n  ");
          cmAlphaNum::cmAlphaNum(&local_2b8,local_60);
          cmStrCat<char[31]>(&local_258,&local_288,&local_2b8,
                             (char (*) [31])"\nthat is not a valid ELF file.");
          cmExecutionStatus::SetError(pcVar2,&local_258);
          std::__cxx11::string::~string((string *)&local_258);
          args_local._7_1_ = 0;
        }
      }
      elf.ErrorMessage.field_2._12_4_ = 1;
      cmELF::~cmELF((cmELF *)local_238);
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_1d8,"READ_ELF given FILE \"");
      cmAlphaNum::cmAlphaNum(&local_208,local_60);
      cmStrCat<char[23]>(&local_1a8,&local_1d8,&local_208,(char (*) [23])"\" that does not exist.");
      cmExecutionStatus::SetError(pcVar2,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      args_local._7_1_ = 0;
      elf.ErrorMessage.field_2._12_4_ = 1;
    }
    HandleReadElfCommand::Arguments::~Arguments((Arguments *)local_168);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleReadElfCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("READ_ELF must be called with at least three additional "
                    "arguments.");
    return false;
  }

  std::string const& fileNameArg = args[1];

  struct Arguments
  {
    std::string RPath;
    std::string RunPath;
    std::string Error;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("RPATH"_s, &Arguments::RPath)
                               .Bind("RUNPATH"_s, &Arguments::RunPath)
                               .Bind("CAPTURE_ERROR"_s, &Arguments::Error);
  Arguments const arguments = parser.Parse(cmMakeRange(args).advance(2),
                                           /*unparsedArguments=*/nullptr);

  if (!cmSystemTools::FileExists(fileNameArg, true)) {
    status.SetError(cmStrCat("READ_ELF given FILE \"", fileNameArg,
                             "\" that does not exist."));
    return false;
  }

  cmELF elf(fileNameArg.c_str());
  if (!elf) {
    if (arguments.Error.empty()) {
      status.SetError(cmStrCat("READ_ELF given FILE:\n  ", fileNameArg,
                               "\nthat is not a valid ELF file."));
      return false;
    }
    status.GetMakefile().AddDefinition(arguments.Error,
                                       "not a valid ELF file");
    return true;
  }

  if (!arguments.RPath.empty()) {
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      std::string rpath(se_rpath->Value);
      std::replace(rpath.begin(), rpath.end(), ':', ';');
      status.GetMakefile().AddDefinition(arguments.RPath, rpath);
    }
  }
  if (!arguments.RunPath.empty()) {
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      std::string runpath(se_runpath->Value);
      std::replace(runpath.begin(), runpath.end(), ':', ';');
      status.GetMakefile().AddDefinition(arguments.RunPath, runpath);
    }
  }

  return true;
}